

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O2

Int128 * helper_atomic_cmpxchgo_le_mmu_mips64
                   (Int128 *__return_storage_ptr__,CPUArchState_conflict11 *env,target_ulong addr,
                   Int128 cmpv,Int128 newv,TCGMemOpIdx oi,uintptr_t retaddr)

{
  Int128 *pIVar1;
  
  pIVar1 = (Int128 *)
           atomic_mmu_lookup((CPUArchState_conflict11 *)__return_storage_ptr__,(target_ulong)env,
                             (TCGMemOpIdx)cmpv,cmpv._8_8_);
  pIVar1 = atomic16_cmpxchg(pIVar1,(Int128 *)addr,cmpv,newv);
  return pIVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}